

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket_location_handler.c
# Opt level: O0

void test_ws_location_wrong_http_headers(void)

{
  cio_http_data_cb_t p_Var1;
  void *pvVar2;
  cio_http_cb_return cVar3;
  size_t sVar4;
  size_t extraout_RDX;
  char *pcVar5;
  undefined1 auStack_b48 [4];
  cio_http_cb_return cb_ret;
  cio_http_client client;
  undefined1 local_770 [4];
  cio_error err;
  cio_websocket_location_handler handler;
  char *sub_protocols [2];
  char *local_210;
  upgrade_test test;
  undefined1 local_1c8 [4];
  uint i;
  upgrade_test tests [7];
  
  memcpy(local_1c8,&PTR_anon_var_dwarf_1c5c_0010cbe0,0x1c0);
  for (test._60_4_ = 0; (uint)test._60_4_ < 7; test._60_4_ = test._60_4_ + 1) {
    memcpy(&local_210,local_1c8 + (ulong)(uint)test._60_4_ * 0x40,0x40);
    handler.websocket.on_control =
         (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)
         anon_var_dwarf_1d28;
    client.buffer_size._4_4_ =
         cio_websocket_location_handler_init
                   ((cio_websocket_location_handler *)local_770,
                    (char **)&handler.websocket.on_control,2,on_connect,fake_handler_free);
    UnityAssertEqualNumber
              (0,(long)client.buffer_size._4_4_,"web socket handler initialization failed!",0x164,
               UNITY_DISPLAY_STYLE_INT);
    pcVar5 = test.sec_key_value;
    p_Var1 = handler.http_location.on_fragment;
    client._232_8_ = local_770;
    client.write_response = fake_add_response_header;
    client.close = fake_write_response;
    _auStack_b48 = client_close;
    client.parser.content_length._4_4_ =
         client.parser.content_length._4_4_ & 0x7fffffff | 0x80000000;
    client.content_length._0_4_ = 1;
    client.rb.fetch_ptr._0_2_ = 1;
    client.rb.fetch_ptr._2_2_ = 1;
    handler.websocket.ws_private.read_handler_context = (cio_http_client *)auStack_b48;
    sVar4 = strlen(test.sec_key_value);
    cVar3 = (*p_Var1)((cio_http_client *)auStack_b48,pcVar5,sVar4);
    UnityAssertEqualNumber
              (0,(long)cVar3,"on_header_field returned wrong value for sec_ws_version_field",0x174,
               UNITY_DISPLAY_STYLE_INT);
    pcVar5 = test.version_field;
    pvVar2 = handler.websocket.ws_private.read_handler_context;
    p_Var1 = handler.http_location.on_header_field_name;
    sVar4 = strlen(test.version_field);
    cVar3 = (*p_Var1)((cio_http_client *)pvVar2,pcVar5,sVar4);
    UnityAssertEqualNumber
              ((long)(int)test.protocol_value,(long)cVar3,
               "on_header_value returned wrong value for sec_ws_version_value",0x176,
               UNITY_DISPLAY_STYLE_INT);
    pcVar5 = local_210;
    pvVar2 = handler.websocket.ws_private.read_handler_context;
    p_Var1 = handler.http_location.on_fragment;
    sVar4 = strlen(local_210);
    cVar3 = (*p_Var1)((cio_http_client *)pvVar2,pcVar5,sVar4);
    UnityAssertEqualNumber
              (0,(long)cVar3,"on_header_field returned wrong value for sec_ws_key_field",0x179,
               UNITY_DISPLAY_STYLE_INT);
    pcVar5 = test.sec_key_field;
    pvVar2 = handler.websocket.ws_private.read_handler_context;
    p_Var1 = handler.http_location.on_header_field_name;
    sVar4 = strlen(test.sec_key_field);
    cVar3 = (*p_Var1)((cio_http_client *)pvVar2,pcVar5,sVar4);
    UnityAssertEqualNumber
              ((long)test.protocol_value._4_4_,(long)cVar3,
               "on_header_value returned wrong value for sec_ws_key_value",0x17b,
               UNITY_DISPLAY_STYLE_INT);
    pcVar5 = test.version_value;
    pvVar2 = handler.websocket.ws_private.read_handler_context;
    p_Var1 = handler.http_location.on_fragment;
    sVar4 = strlen(test.version_value);
    cVar3 = (*p_Var1)((cio_http_client *)pvVar2,pcVar5,sVar4);
    UnityAssertEqualNumber
              (0,(long)cVar3,"on_header_field returned wrong value for protocol_field",0x17e,
               UNITY_DISPLAY_STYLE_INT);
    pcVar5 = test.protocol_field;
    pvVar2 = handler.websocket.ws_private.read_handler_context;
    p_Var1 = handler.http_location.on_header_field_name;
    sVar4 = strlen(test.protocol_field);
    cVar3 = (*p_Var1)((cio_http_client *)pvVar2,pcVar5,sVar4);
    pcVar5 = (char *)(long)cVar3;
    UnityAssertEqualNumber
              (0,(UNITY_INT)pcVar5,"on_header_value returned wrong value for protocol_value",0x180,
               UNITY_DISPLAY_STYLE_INT);
    cVar3 = (*handler.http_location.on_header_field_value)
                      ((cio_http_client *)handler.websocket.ws_private.read_handler_context,pcVar5,
                       extraout_RDX);
    UnityAssertEqualNumber
              ((long)test.on_header_value_retval_version,(long)cVar3,
               "on_header_complete returned wrong value",0x183,UNITY_DISPLAY_STYLE_INT);
    if (test.on_header_value_retval_version == CIO_HTTP_CB_SKIP_BODY) {
      UnityAssertEqualNumber
                (1,(ulong)fake_write_response_fake.call_count,"write_response was not called",0x185,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (1,(ulong)on_connect_fake.call_count,"websocket on_connect was not called",0x186,
                 UNITY_DISPLAY_STYLE_INT);
      UnityAssertEqualNumber
                (0x65,(ulong)fake_write_response_fake.arg1_val,
                 "write_response was not called with CIO_HTTP_STATUS_SWITCHING_PROTOCOLS",0x187,
                 UNITY_DISPLAY_STYLE_INT);
      (*(code *)handler.websocket.ws_private._112_8_)
                ((undefined1 *)((long)&handler.wb_protocol_end.data + 8));
    }
    setUp();
  }
  return;
}

Assistant:

static void test_ws_location_wrong_http_headers(void)
{
	struct upgrade_test {
		const char *sec_key_field;
		const char *sec_key_value;
		const char *version_field;
		const char *version_value;
		const char *protocol_field;
		const char *protocol_value;
		enum cio_http_cb_return on_header_value_retval_version;
		enum cio_http_cb_return on_header_value_retval_key;
		enum cio_http_cb_return on_headers_retval;
	};

	struct upgrade_test tests[] = {
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "13",
	     .on_header_value_retval_version = CIO_HTTP_CB_SUCCESS,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_SKIP_BODY},
	    {.sec_key_field = "Sic-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "13",
	     .on_header_value_retval_version = CIO_HTTP_CB_SUCCESS,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_ERROR},
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Wersion",
	     .version_value = "13",
	     .on_header_value_retval_version = CIO_HTTP_CB_SUCCESS,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_ERROR},
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "lIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_ERROR,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "13",
	     .on_header_value_retval_version = CIO_HTTP_CB_SUCCESS,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_ERROR},
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "12",
	     .on_header_value_retval_version = CIO_HTTP_CB_ERROR,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_ERROR},
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "2",
	     .on_header_value_retval_version = CIO_HTTP_CB_ERROR,
	     .protocol_field = "Sec-WebSocket-Protocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_ERROR},
	    {.sec_key_field = "Sec-WebSocket-Key",
	     .sec_key_value = "dGhlIHNhbXBsZSBub25jZQ==",
	     .on_header_value_retval_key = CIO_HTTP_CB_SUCCESS,
	     .version_field = "Sec-WebSocket-Version",
	     .version_value = "13",
	     .on_header_value_retval_version = CIO_HTTP_CB_SUCCESS,
	     .protocol_field = "Sec-WebSocket-Portocol",
	     .protocol_value = "jet",
	     .on_headers_retval = CIO_HTTP_CB_SKIP_BODY}};

	for (unsigned int i = 0; i < ARRAY_SIZE(tests); i++) {
		struct upgrade_test test = tests[i];

		const char *sub_protocols[] = {"echo", "jet"};
		struct cio_websocket_location_handler handler;
		enum cio_error err = cio_websocket_location_handler_init(&handler, sub_protocols, ARRAY_SIZE(sub_protocols), on_connect, fake_handler_free);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "web socket handler initialization failed!");

		struct cio_http_client client;

		handler.websocket.ws_private.http_client = &client;
		handler.websocket.ws_private.http_client->current_handler = &handler.http_location;
		handler.websocket.ws_private.http_client->add_response_header = fake_add_response_header;
		handler.websocket.ws_private.http_client->write_response = fake_write_response;
		handler.websocket.ws_private.http_client->close = client_close;

		handler.websocket.ws_private.http_client->parser.upgrade = 1;
		handler.websocket.ws_private.http_client->http_method = CIO_HTTP_GET;
		handler.websocket.ws_private.http_client->http_major = 1;
		handler.websocket.ws_private.http_client->http_minor = 1;

		enum cio_http_cb_return cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, test.version_field, strlen(test.version_field));
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_version_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, test.version_value, strlen(test.version_value));
		TEST_ASSERT_EQUAL_MESSAGE(test.on_header_value_retval_version, cb_ret, "on_header_value returned wrong value for sec_ws_version_value");

		cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, test.sec_key_field, strlen(test.sec_key_field));
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for sec_ws_key_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, test.sec_key_value, strlen(test.sec_key_value));
		TEST_ASSERT_EQUAL_MESSAGE(test.on_header_value_retval_key, cb_ret, "on_header_value returned wrong value for sec_ws_key_value");

		cb_ret = handler.http_location.on_header_field_name(handler.websocket.ws_private.http_client, test.protocol_field, strlen(test.protocol_field));
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_field returned wrong value for protocol_field");
		cb_ret = handler.http_location.on_header_field_value(handler.websocket.ws_private.http_client, test.protocol_value, strlen(test.protocol_value));
		TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_CB_SUCCESS, cb_ret, "on_header_value returned wrong value for protocol_value");

		cb_ret = handler.http_location.on_headers_complete(handler.websocket.ws_private.http_client);
		TEST_ASSERT_EQUAL_MESSAGE(test.on_headers_retval, cb_ret, "on_header_complete returned wrong value");
		if (test.on_headers_retval == CIO_HTTP_CB_SKIP_BODY) {
			TEST_ASSERT_EQUAL_MESSAGE(1, fake_write_response_fake.call_count, "write_response was not called");
			TEST_ASSERT_EQUAL_MESSAGE(1, on_connect_fake.call_count, "websocket on_connect was not called");
			TEST_ASSERT_EQUAL_MESSAGE(CIO_HTTP_STATUS_SWITCHING_PROTOCOLS, fake_write_response_fake.arg1_val, "write_response was not called with CIO_HTTP_STATUS_SWITCHING_PROTOCOLS");

			handler.websocket.ws_private.close_hook(&handler.websocket);
		}

		setUp();
	}
}